

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O1

MESSAGE_SENDER_HANDLE
messagesender_create
          (LINK_HANDLE link,ON_MESSAGE_SENDER_STATE_CHANGED on_message_sender_state_changed,
          void *context)

{
  MESSAGE_SENDER_HANDLE pMVar1;
  LOGGER_LOG p_Var2;
  
  pMVar1 = (MESSAGE_SENDER_HANDLE)calloc(1,0x38);
  if (pMVar1 == (MESSAGE_SENDER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                ,"messagesender_create",0x305,1,"Failed allocating message sender");
    }
  }
  else {
    pMVar1->message_count = 0;
    pMVar1->messages = (ASYNC_OPERATION_HANDLE *)0x0;
    pMVar1->link = link;
    pMVar1->on_message_sender_state_changed = on_message_sender_state_changed;
    pMVar1->on_message_sender_state_changed_context = context;
    pMVar1->message_sender_state = MESSAGE_SENDER_STATE_IDLE;
    pMVar1->field_0x30 = pMVar1->field_0x30 & 0xfe;
  }
  return pMVar1;
}

Assistant:

MESSAGE_SENDER_HANDLE messagesender_create(LINK_HANDLE link, ON_MESSAGE_SENDER_STATE_CHANGED on_message_sender_state_changed, void* context)
{
    MESSAGE_SENDER_INSTANCE* message_sender = (MESSAGE_SENDER_INSTANCE*)calloc(1, sizeof(MESSAGE_SENDER_INSTANCE));
    if (message_sender == NULL)
    {
        LogError("Failed allocating message sender");
    }
    else
    {
        message_sender->messages = NULL;
        message_sender->message_count = 0;
        message_sender->link = link;
        message_sender->on_message_sender_state_changed = on_message_sender_state_changed;
        message_sender->on_message_sender_state_changed_context = context;
        message_sender->message_sender_state = MESSAGE_SENDER_STATE_IDLE;
        message_sender->is_trace_on = 0;
    }

    return message_sender;
}